

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

bool __thiscall FTraceInfo::LineCheck(FTraceInfo *this,intercept_t *in,double dist,DVector3 *hit)

{
  double dVar1;
  sector_t_conflict *psVar2;
  BYTE BVar3;
  double dVar4;
  bool bVar5;
  FTextureID FVar6;
  uint uVar7;
  ETraceStatus EVar8;
  secplane_t *psVar9;
  xfloor *this_00;
  F3DFloor **ppFVar10;
  double local_188;
  sector_t_conflict *local_180;
  double fcc;
  double cc;
  double ffc;
  double cf;
  double local_128;
  double ff_top;
  double local_110;
  double ff_bottom;
  F3DFloor *pFStack_100;
  int entershootthrough;
  F3DFloor *rover;
  iterator __end5;
  iterator __begin5;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range5;
  TVector2<double> local_d8;
  TVector2<double> local_c8;
  sector_t_conflict *local_b8;
  sector_t_conflict *hsec;
  TVector2<double> local_a0;
  TVector2<double> local_90;
  TVector2<double> local_80;
  TVector2<double> local_70;
  double local_60;
  double bc;
  double bf;
  double fc;
  double ff;
  sector_t_conflict *entersector;
  DVector3 *pDStack_30;
  int lineside;
  DVector3 *hit_local;
  double dist_local;
  intercept_t *in_local;
  FTraceInfo *this_local;
  
  bc = 0.0;
  local_60 = 0.0;
  pDStack_30 = hit;
  hit_local = (DVector3 *)dist;
  dist_local = (double)in;
  in_local = (intercept_t *)this;
  if (((in->d).line)->frontsector->sectornum == this->CurSector->sectornum) {
    entersector._4_4_ = 0;
  }
  else if ((((in->d).line)->backsector == (sector_t_conflict *)0x0) ||
          (((in->d).line)->backsector->sectornum != this->CurSector->sectornum)) {
    if (((in->d).line)->backsector == (sector_t_conflict *)0x0) {
      entersector._4_4_ = 0;
      this->CurSector = (sector_t_conflict *)(((in->d).thing)->SpriteAngle).Degrees;
    }
    else {
      TVector2<double>::TVector2(&local_70,&this->Start);
      entersector._4_4_ =
           P_PointOnLineSide(&local_70,*(line_t_conflict **)((long)dist_local + 0x10));
      if (entersector._4_4_ == 0) {
        local_180 = *(sector_t_conflict **)(*(long *)((long)dist_local + 0x10) + 0x78);
      }
      else {
        local_180 = *(sector_t_conflict **)(*(long *)((long)dist_local + 0x10) + 0x80);
      }
      this->CurSector = local_180;
    }
  }
  else {
    entersector._4_4_ = 1;
  }
  if ((*(uint *)(*(long *)((long)dist_local + 0x10) + 0x20) & 4) == 0) {
    ff = 0.0;
  }
  else {
    if (entersector._4_4_ == 0) {
      local_188 = *(double *)(*(long *)((long)dist_local + 0x10) + 0x80);
    }
    else {
      local_188 = *(double *)(*(long *)((long)dist_local + 0x10) + 0x78);
    }
    ff = local_188;
    if (((i_compatflags & 0x2000U) != 0) &&
       (*(long *)(*(long *)((long)dist_local + 0x10) + 0x80) ==
        *(long *)(*(long *)((long)dist_local + 0x10) + 0x78))) {
      if ((this->TraceFlags & 2) != 0) {
        P_ActivateLine(*(line_t_conflict **)((long)dist_local + 0x10),this->IgnoreThis,
                       entersector._4_4_,0x20,(DVector3 *)0x0);
      }
      if ((this->TraceFlags & 4) != 0) {
        P_ActivateLine(*(line_t_conflict **)((long)dist_local + 0x10),this->IgnoreThis,
                       entersector._4_4_,8,(DVector3 *)0x0);
      }
      return true;
    }
  }
  psVar2 = this->CurSector;
  TVector2<double>::TVector2(&local_80,hit);
  fc = secplane_t::ZatPoint(&psVar2->floorplane,&local_80);
  psVar2 = this->CurSector;
  TVector2<double>::TVector2(&local_90,hit);
  bf = secplane_t::ZatPoint(&psVar2->ceilingplane,&local_90);
  if (ff != 0.0) {
    psVar9 = (secplane_t *)((long)ff + 0xb0);
    TVector2<double>::TVector2(&local_a0,hit);
    bc = secplane_t::ZatPoint(psVar9,&local_a0);
    psVar9 = (secplane_t *)((long)ff + 0xd8);
    TVector2<double>::TVector2((TVector2<double> *)&hsec,hit);
    local_60 = secplane_t::ZatPoint(psVar9,(DVector2 *)&hsec);
  }
  local_b8 = sector_t::GetHeightSec((sector_t *)this->CurSector);
  bVar5 = false;
  if ((this->Results->CrossedWater == (sector_t *)0x0) &&
     (bVar5 = false, local_b8 != (sector_t_conflict *)0x0)) {
    dVar1 = (this->Start).Z;
    psVar9 = &local_b8->floorplane;
    TVector2<double>::TVector2(&local_c8,&this->Start);
    dVar4 = secplane_t::ZatPoint(psVar9,&local_c8);
    bVar5 = false;
    if (dVar4 < dVar1) {
      dVar1 = hit->Z;
      psVar9 = &local_b8->floorplane;
      TVector2<double>::TVector2(&local_d8,hit);
      dVar4 = secplane_t::ZatPoint(psVar9,&local_d8);
      bVar5 = dVar1 <= dVar4;
    }
  }
  if ((bVar5) && (bVar5 = CheckSectorPlane(this,local_b8,true), bVar5)) {
    this->Results->CrossedWater = (sector_t *)(sectors + this->CurSector->sectornum);
    TVector3<double>::operator=(&this->Results->CrossedWaterPos,&this->Results->HitPos);
    this->Results->Distance = 0.0;
  }
  if (fc < hit->Z) {
    if (hit->Z < bf) {
      if ((((ff == 0.0) || (hit->Z < bc)) || (local_60 < hit->Z)) ||
         ((*(uint *)(*(long *)((long)dist_local + 0x10) + 0x20) & this->WallMask) != 0)) {
        this->Results->HitType = TRACE_HitWall;
        if (ff == 0.0) {
          BVar3 = '\0';
        }
        else if (bc < hit->Z) {
          BVar3 = local_60 <= hit->Z;
        }
        else {
          BVar3 = '\x02';
        }
        this->Results->Tier = BVar3;
        if ((this->TraceFlags & 4) != 0) {
          P_ActivateLine(*(line_t_conflict **)((long)dist_local + 0x10),this->IgnoreThis,
                         entersector._4_4_,8,(DVector3 *)0x0);
        }
      }
      else {
        uVar7 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)(*(long *)((long)ff + 0x210) + 0x70));
        if (uVar7 != 0) {
          memcpy(this->DummySector + this->sectorsel,(void *)ff,0x218);
          ff = (double)(this->DummySector + this->sectorsel);
          this->sectorsel = this->sectorsel ^ 1;
          this_00 = &((sector_t_conflict *)ff)->e->XFloor;
          __end5 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
          rover = (F3DFloor *)
                  TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
          while (bVar5 = TIterator<F3DFloor_*>::operator!=(&__end5,(TIterator<F3DFloor_*> *)&rover),
                bVar5) {
            ppFVar10 = TIterator<F3DFloor_*>::operator*(&__end5);
            pFStack_100 = *ppFVar10;
            ff_bottom._4_4_ = (uint)((pFStack_100->flags & 0x4000000) != 0);
            if ((ff_bottom._4_4_ != this->inshootthrough) && ((pFStack_100->flags & 1) != 0)) {
              psVar9 = (pFStack_100->bottom).plane;
              TVector2<double>::TVector2((TVector2<double> *)&ff_top,hit);
              local_110 = secplane_t::ZatPoint(psVar9,(DVector2 *)&ff_top);
              psVar9 = (pFStack_100->top).plane;
              TVector2<double>::TVector2((TVector2<double> *)&cf,hit);
              local_128 = secplane_t::ZatPoint(psVar9,(DVector2 *)&cf);
              if (hit->Z <= local_128) {
                if (local_110 <= hit->Z) {
                  this->Results->HitType = TRACE_HitWall;
                  this->Results->Tier = '\x03';
                  this->Results->ffloor = pFStack_100;
                  if (((this->TraceFlags & 4) != 0) &&
                     (*(int *)(*(long *)((long)dist_local + 0x10) + 0x28) != 0)) {
                    P_ActivateLine(*(line_t_conflict **)((long)dist_local + 0x10),this->IgnoreThis,
                                   entersector._4_4_,8,(DVector3 *)0x0);
                  }
                  goto LAB_0060e989;
                }
                if (ABS(local_60 - local_110) < 1.52587890625e-05) {
                  dVar1 = secplane_t::ZatPoint
                                    ((secplane_t *)((long)ff + 0xd8),(DVector2 *)((long)ff + 0x120))
                  ;
                  dVar4 = secplane_t::ZatPoint
                                    ((pFStack_100->bottom).plane,(DVector2 *)((long)ff + 0x120));
                  if (dVar4 < dVar1) {
                    local_60 = local_110 + 1.52587890625e-05;
                  }
                }
                if (local_110 < local_60) {
                  secplane_t::operator=((secplane_t *)((long)ff + 0xd8),(pFStack_100->bottom).plane)
                  ;
                  sector_t::SetTexture
                            ((sector_t *)ff,1,(FTextureID)((pFStack_100->bottom).texture)->texnum,
                             false);
                  sector_t::ClearPortal((sector_t *)ff,1);
                  local_60 = local_110;
                }
              }
              else {
                if (ABS(bc - local_128) < 1.52587890625e-05) {
                  dVar1 = secplane_t::ZatPoint
                                    ((secplane_t *)((long)ff + 0xb0),(DVector2 *)((long)ff + 0x120))
                  ;
                  dVar4 = secplane_t::ZatPoint
                                    ((pFStack_100->top).plane,(DVector2 *)((long)ff + 0x120));
                  if (dVar1 < dVar4) {
                    bc = local_128 - 1.52587890625e-05;
                  }
                }
                if (bc < local_128) {
                  secplane_t::operator=((secplane_t *)((long)ff + 0xb0),(pFStack_100->top).plane);
                  sector_t::SetTexture
                            ((sector_t *)ff,0,(FTextureID)((pFStack_100->top).texture)->texnum,false
                            );
                  sector_t::ClearPortal((sector_t *)ff,0);
                  bc = local_128;
                }
              }
            }
            TIterator<F3DFloor_*>::operator++(&__end5);
          }
        }
        this->Results->HitType = TRACE_HitNone;
        if ((this->TraceFlags & 2) != 0) {
          P_ActivateLine(*(line_t_conflict **)((long)dist_local + 0x10),this->IgnoreThis,
                         entersector._4_4_,0x20,(DVector3 *)0x0);
        }
        if ((this->TraceFlags & 4) != 0) {
          P_ActivateLine(*(line_t_conflict **)((long)dist_local + 0x10),this->IgnoreThis,
                         entersector._4_4_,8,(DVector3 *)0x0);
        }
      }
    }
    else {
      this->Results->HitType = TRACE_HitCeiling;
      FVar6 = sector_t::GetTexture((sector_t *)this->CurSector,1);
      (this->Results->HitTexture).texnum = FVar6.texnum;
    }
  }
  else {
    this->Results->HitType = TRACE_HitFloor;
    FVar6 = sector_t::GetTexture((sector_t *)this->CurSector,0);
    (this->Results->HitTexture).texnum = FVar6.texnum;
  }
LAB_0060e989:
  if (this->Results->HitType != TRACE_HitNone) {
    this->Results->Sector = (sector_t *)(sectors + this->CurSector->sectornum);
    if ((this->Results->HitType != TRACE_HitWall) &&
       (bVar5 = CheckSectorPlane(this,this->CurSector,this->Results->HitType == TRACE_HitFloor),
       !bVar5)) {
      if (ff == 0.0) {
        this->Results->HitType = TRACE_HitWall;
        this->Results->Tier = '\0';
      }
      else if ((hit->Z <= bc) || (local_60 <= hit->Z)) {
        this->Results->HitType = TRACE_HitWall;
        if (bc < hit->Z) {
          BVar3 = local_60 <= hit->Z;
        }
        else {
          BVar3 = '\x02';
        }
        this->Results->Tier = BVar3;
      }
      else {
        this->Results->HitType = TRACE_HitNone;
      }
      if ((this->Results->HitType == TRACE_HitWall) && ((this->TraceFlags & 4) != 0)) {
        P_ActivateLine(*(line_t_conflict **)((long)dist_local + 0x10),this->IgnoreThis,
                       entersector._4_4_,8,(DVector3 *)0x0);
      }
    }
    if (this->Results->HitType == TRACE_HitWall) {
      TVector3<double>::operator=(&this->Results->HitPos,hit);
      SetSourcePosition(this);
      this->Results->Distance = (double)hit_local;
      this->Results->Fraction = *(double *)dist_local;
      this->Results->Line = *(line_t **)((long)dist_local + 0x10);
      this->Results->Side = (BYTE)entersector._4_4_;
    }
  }
  if ((this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) &&
     (this->Results->HitType != TRACE_HitNone)) {
    EVar8 = (*this->TraceCallback)(this->Results,this->TraceCallbackData);
    if (EVar8 == TRACE_Stop) {
      return false;
    }
    if (EVar8 == TRACE_Skip) {
      this->Results->HitType = TRACE_HitNone;
    }
    else if (EVar8 == TRACE_Abort) {
      this->Results->HitType = TRACE_HitNone;
      return false;
    }
  }
  bVar5 = this->Results->HitType == TRACE_HitNone;
  if (bVar5) {
    this->CurSector = (sector_t_conflict *)ff;
    this->EnterDist = (double)hit_local;
  }
  return bVar5;
}

Assistant:

bool FTraceInfo::LineCheck(intercept_t *in, double dist, DVector3 hit)
{
	int lineside;
	sector_t *entersector;

	double ff, fc, bf = 0, bc = 0;

	if (in->d.line->frontsector->sectornum == CurSector->sectornum)
	{
		lineside = 0;
	}
	else if (in->d.line->backsector && in->d.line->backsector->sectornum == CurSector->sectornum)
	{
		lineside = 1;
	}
	else
	{ // Dammit. Why does Doom have to allow non-closed sectors?
		if (in->d.line->backsector == NULL)
		{
			lineside = 0;
			CurSector = in->d.line->frontsector;
		}
		else
		{
			lineside = P_PointOnLineSide(Start, in->d.line);
			CurSector = lineside ? in->d.line->backsector : in->d.line->frontsector;
		}
	}

	if (!(in->d.line->flags & ML_TWOSIDED))
	{
		entersector = NULL;
	}
	else
	{
		entersector = (lineside == 0) ? in->d.line->backsector : in->d.line->frontsector;

		// For backwards compatibility: Ignore lines with the same sector on both sides.
		// This is the way Doom.exe did it and some WADs (e.g. Alien Vendetta MAP15) need it.
		if (i_compatflags & COMPATF_TRACE && in->d.line->backsector == in->d.line->frontsector)
		{
			// We must check special activation here because the code below is never reached.
			if (TraceFlags & TRACE_PCross)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_PCross);
			}
			if (TraceFlags & TRACE_Impact)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
			}
			return true;
		}
	}

	ff = CurSector->floorplane.ZatPoint(hit);
	fc = CurSector->ceilingplane.ZatPoint(hit);

	if (entersector != NULL)
	{
		bf = entersector->floorplane.ZatPoint(hit);
		bc = entersector->ceilingplane.ZatPoint(hit);
	}

	sector_t *hsec = CurSector->GetHeightSec();
	if (Results->CrossedWater == NULL &&
		hsec != NULL &&
		Start.Z > hsec->floorplane.ZatPoint(Start) &&
		hit.Z <= hsec->floorplane.ZatPoint(hit))
	{
		// hit crossed a water plane
		if (CheckSectorPlane(hsec, true))
		{
			Results->CrossedWater = &sectors[CurSector->sectornum];
			Results->CrossedWaterPos = Results->HitPos;
			Results->Distance = 0;
		}
	}

	if (hit.Z <= ff)
	{
		// hit floor in front of wall
		Results->HitType = TRACE_HitFloor;
		Results->HitTexture = CurSector->GetTexture(sector_t::floor);
	}
	else if (hit.Z >= fc)
	{
		// hit ceiling in front of wall
		Results->HitType = TRACE_HitCeiling;
		Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
	}
	else if (entersector == NULL ||
		hit.Z < bf || hit.Z > bc ||
		in->d.line->flags & WallMask)
	{
		// hit the wall
		Results->HitType = TRACE_HitWall;
		Results->Tier =
			entersector == NULL ? TIER_Middle :
			hit.Z <= bf ? TIER_Lower :
			hit.Z >= bc ? TIER_Upper : TIER_Middle;
		if (TraceFlags & TRACE_Impact)
		{
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
		}
	}
	else
	{ 	// made it past the wall
		// check for 3D floors first
		if (entersector->e->XFloor.ffloors.Size())
		{
			memcpy(&DummySector[sectorsel], entersector, sizeof(sector_t));
			entersector = &DummySector[sectorsel];
			sectorsel ^= 1;

			for (auto rover : entersector->e->XFloor.ffloors)
			{
				int entershootthrough = !!(rover->flags&FF_SHOOTTHROUGH);

				if (entershootthrough != inshootthrough && rover->flags&FF_EXISTS)
				{
					double ff_bottom = rover->bottom.plane->ZatPoint(hit);
					double ff_top = rover->top.plane->ZatPoint(hit);

					// clip to the part of the sector we are in
					if (hit.Z > ff_top)
					{
						// 3D floor height is the same as the floor height. We need to test a second spot to see if it is above or below
						if (fabs(bf - ff_top) < EQUAL_EPSILON)
						{
							double cf = entersector->floorplane.ZatPoint(entersector->centerspot);
							double ffc = rover->top.plane->ZatPoint(entersector->centerspot);
							if (ffc > cf)
							{
								bf = ff_top - EQUAL_EPSILON;
							}
						}
						
						// above
						if (bf < ff_top)
						{
							entersector->floorplane = *rover->top.plane;
							entersector->SetTexture(sector_t::floor, *rover->top.texture, false);
							entersector->ClearPortal(sector_t::floor);
							bf = ff_top;
						}
					}
					else if (hit.Z < ff_bottom)
					{
						// 3D floor height is the same as the ceiling height. We need to test a second spot to see if it is above or below
						if (fabs(bc - ff_bottom) < EQUAL_EPSILON)
						{
							double cc = entersector->ceilingplane.ZatPoint(entersector->centerspot);
							double fcc = rover->bottom.plane->ZatPoint(entersector->centerspot);
							if (fcc < cc)
							{
								bc = ff_bottom + EQUAL_EPSILON;
							}
						}

						//below
						if (bc > ff_bottom)
						{
							entersector->ceilingplane = *rover->bottom.plane;
							entersector->SetTexture(sector_t::ceiling, *rover->bottom.texture, false);
							entersector->ClearPortal(sector_t::ceiling);
							bc = ff_bottom;
						}
					}
					else
					{
						//hit the edge - equivalent to hitting the wall
						Results->HitType = TRACE_HitWall;
						Results->Tier = TIER_FFloor;
						Results->ffloor = rover;
						if ((TraceFlags & TRACE_Impact) && in->d.line->special)
						{
							P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
						}
						goto cont;
					}
				}
			}
		}

		Results->HitType = TRACE_HitNone;
		if (TraceFlags & TRACE_PCross)
		{
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_PCross);
		}
		if (TraceFlags & TRACE_Impact)
		{ // This is incorrect for "impact", but Hexen did this, so
		  // we need to as well, for compatibility
			P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
		}
	}
cont:

	if (Results->HitType != TRACE_HitNone)
	{
		// We hit something, so figure out where exactly
		Results->Sector = &sectors[CurSector->sectornum];

		if (Results->HitType != TRACE_HitWall &&
			!CheckSectorPlane(CurSector, Results->HitType == TRACE_HitFloor))
		{ // trace is parallel to the plane (or right on it)
			if (entersector == NULL)
			{
				Results->HitType = TRACE_HitWall;
				Results->Tier = TIER_Middle;
			}
			else
			{
				if (hit.Z <= bf || hit.Z >= bc)
				{
					Results->HitType = TRACE_HitWall;
					Results->Tier =
						hit.Z <= bf ? TIER_Lower :
						hit.Z >= bc ? TIER_Upper : TIER_Middle;
				}
				else
				{
					Results->HitType = TRACE_HitNone;
				}
			}
			if (Results->HitType == TRACE_HitWall && TraceFlags & TRACE_Impact)
			{
				P_ActivateLine(in->d.line, IgnoreThis, lineside, SPAC_Impact);
			}
		}

		if (Results->HitType == TRACE_HitWall)
		{
			Results->HitPos = hit;
			SetSourcePosition();
			Results->Distance = dist;
			Results->Fraction = in->frac;
			Results->Line = in->d.line;
			Results->Side = lineside;
		}
	}

	if (TraceCallback != NULL && Results->HitType != TRACE_HitNone)
	{
		switch (TraceCallback(*Results, TraceCallbackData))
		{
		case TRACE_Stop:	return false;
		case TRACE_Abort:	Results->HitType = TRACE_HitNone; return false;
		case TRACE_Skip:	Results->HitType = TRACE_HitNone; break;
		default:			break;
		}
	}

	if (Results->HitType == TRACE_HitNone)
	{
		CurSector = entersector;
		EnterDist = dist;
		return true;
	}
	else
	{
		return false;
	}
}